

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateSerializationCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "com.google.protobuf.GeneratedMessage$ver$\n  .serialize$short_key_type$MapTo(\n    output,\n    internalGet$capitalized_name$(),\n    $default_entry$,\n    $number$);\n"
                    );
  return;
}

Assistant:

void ImmutableMapFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(
      variables_,
      "com.google.protobuf.GeneratedMessage$ver$\n"
      "  .serialize$short_key_type$MapTo(\n"
      "    output,\n"
      "    internalGet$capitalized_name$(),\n"
      "    $default_entry$,\n"
      "    $number$);\n");
}